

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O1

EventRegistry * __thiscall
license::FullLicenseInfo::validate
          (EventRegistry *__return_storage_ptr__,FullLicenseInfo *this,int sw_version)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FUNCTION_RETURN FVar2;
  EVENT_TYPE EVar3;
  time_t tVar4;
  time_t tVar5;
  PcSignature str_code;
  string local_48;
  
  EventRegistry::EventRegistry(__return_storage_ptr__);
  os_initialize();
  printForSign_abi_cxx11_(&local_48,this);
  FVar2 = verifySignature(local_48._M_dataplus._M_p,(this->license_signature)._M_dataplus._M_p);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  EVar3 = LICENSE_CORRUPTED;
  if (FVar2 == FUNC_RET_OK) {
    EVar3 = LICENSE_VERIFIED;
  }
  EventRegistry::addEvent(__return_storage_ptr__,EVar3,(uint)(FVar2 != FUNC_RET_OK) * 2);
  if (this->has_expiry == true) {
    tVar4 = time((time_t *)0x0);
    tVar5 = seconds_from_epoch((this->to_date)._M_dataplus._M_p);
    if (tVar5 < tVar4) {
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
      EventRegistry::addEvent(__return_storage_ptr__,PRODUCT_EXPIRED,SVRT_ERROR,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    tVar5 = seconds_from_epoch((this->from_date)._M_dataplus._M_p);
    if (tVar4 < tVar5) {
      EventRegistry::addEvent(__return_storage_ptr__,PRODUCT_EXPIRED,SVRT_ERROR);
    }
  }
  if (this->has_client_sig == true) {
    strncpy((char *)&local_48,(this->client_signature)._M_dataplus._M_p,0x14);
    EVar3 = validate_pc_signature((char *)&local_48);
    if (EVar3 != LICENSE_OK) {
      EventRegistry::addEvent(__return_storage_ptr__,EVar3,SVRT_ERROR);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

EventRegistry FullLicenseInfo::validate(int sw_version) {
	EventRegistry er;
	os_initialize();
	FUNCTION_RETURN sigVer = verifySignature(printForSign().c_str(),
			license_signature.c_str());
	bool sigVerified = sigVer == FUNC_RET_OK;
	if (sigVerified) {
		er.addEvent(LICENSE_VERIFIED, SVRT_INFO);
	} else {
		er.addEvent(LICENSE_CORRUPTED, SVRT_ERROR);
	}
	if (has_expiry) {
		time_t now = time(NULL);
		if (expires_on() < now) {
			er.addEvent(PRODUCT_EXPIRED, SVRT_ERROR, "");
		}
		if (valid_from() > now) {
			er.addEvent(PRODUCT_EXPIRED, SVRT_ERROR);
		}
	}
	if (has_client_sig) {
		PcSignature str_code;
		strncpy(str_code, client_signature.c_str(), sizeof(str_code)-1);
		EVENT_TYPE event = validate_pc_signature(str_code);
		if (event != LICENSE_OK) {
			er.addEvent(event, SVRT_ERROR);
		}
	}
	return er;
}